

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::
     PostWalker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
     scan(TestStringifyWalker *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  _func_void_TestStringifyWalker_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    ::wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_001c668f:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_001c62c4:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_001c668f;
    }
    local_38 = pEVar1 + 2;
    local_40 = StringifyWalker<TestStringifyWalker>::scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,wasm::UnifiedExpressionVisitor<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(StringifyTest_Print_Test::TestBody()::TestStringifyWalker*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,wasm::UnifiedExpressionVisitor<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,void>>::Task,10ul>
                  *)&(self->super_StringifyWalker<TestStringifyWalker>).
                     super_PostWalker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     .
                     super_Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    goto LAB_001c610d;
  case LoopId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_001c668f;
    }
    goto LAB_001c5be8;
  case BreakId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_001c668f;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = StringifyWalker<TestStringifyWalker>::scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,wasm::UnifiedExpressionVisitor<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(StringifyTest_Print_Test::TestBody()::TestStringifyWalker*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,wasm::UnifiedExpressionVisitor<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,void>>::Task,10ul>
                  *)&(self->super_StringifyWalker<TestStringifyWalker>).
                     super_PostWalker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     .
                     super_Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_001c5a4c;
  case SwitchId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_001c668f;
    }
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x001c5a46;
  case CallId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_001c668f;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_001c668f;
    }
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_001c668f;
    }
    break;
  case LocalSetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_001c668f;
    }
    goto LAB_001c61ff;
  case GlobalGetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_001c668f;
    }
    break;
  case GlobalSetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_001c668f;
    }
    goto LAB_001c5be8;
  case LoadId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_001c668f;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_001c620d;
  case StoreId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_001c668f;
    }
    goto LAB_001c5eac;
  case ConstId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_001c668f;
    }
    break;
  case UnaryId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_001c668f;
    }
    goto LAB_001c61ff;
  case BinaryId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_001c668f;
    }
    goto LAB_001c5e43;
  case SelectId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_001c668f;
    }
    goto LAB_001c60fe;
  case DropId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_001c668f;
    }
    goto LAB_001c5ca4;
  case ReturnId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_001c668f;
    }
    goto LAB_001c5a3d;
  case MemorySizeId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_001c668f;
    }
    break;
  case MemoryGrowId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_001c668f;
    }
    goto LAB_001c5ca4;
  case NopId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_001c668f;
    }
    break;
  case UnreachableId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_001c668f;
    }
    break;
  case AtomicRMWId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_001c668f;
    }
    goto LAB_001c5f2f;
  case AtomicCmpxchgId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_001c668f;
    }
    goto LAB_001c5f20;
  case AtomicWaitId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_001c668f;
    }
    goto LAB_001c5c09;
  case AtomicNotifyId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_001c668f;
    }
    goto LAB_001c5e43;
  case AtomicFenceId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_001c668f;
    }
    break;
  case SIMDExtractId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_001c668f;
    }
    goto LAB_001c61ff;
  case SIMDReplaceId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_001c668f;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_001c5e4e;
  case SIMDShuffleId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_001c668f;
    }
    goto LAB_001c610d;
  case SIMDTernaryId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_001c668f;
    }
    goto LAB_001c5c09;
  case SIMDShiftId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_001c668f;
    }
    goto LAB_001c5e43;
  case SIMDLoadId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_001c668f;
    }
    goto LAB_001c5dc8;
  case SIMDLoadStoreLaneId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_001c668f;
    }
LAB_001c5eac:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_001c620d;
  case MemoryInitId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_001c668f;
    }
    goto LAB_001c5f20;
  case DataDropId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_001c668f;
    }
    break;
  case MemoryCopyId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_001c668f;
    }
    goto LAB_001c60fe;
  case MemoryFillId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_001c668f;
    }
    goto LAB_001c60fe;
  case PopId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_001c668f;
    }
    break;
  case RefNullId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_001c668f;
    }
    break;
  case RefIsNullId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_001c668f;
    }
    goto LAB_001c5ca4;
  case RefFuncId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_001c668f;
    }
    break;
  case RefEqId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_001c668f;
    }
    goto LAB_001c610d;
  case TableGetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_001c668f;
    }
    goto LAB_001c5be8;
  case TableSetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_001c668f;
    }
    goto LAB_001c5f2f;
  case TableSizeId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_001c668f;
    }
    break;
  case TableGrowId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_001c668f;
    }
    goto LAB_001c5f2f;
  case TableFillId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableFill,currp);
    if (pEVar1->_id != TableFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableFill]";
      goto LAB_001c668f;
    }
    goto LAB_001c5f20;
  case TableCopyId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableCopy,currp);
    if (pEVar1->_id != TableCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableCopy]";
      goto LAB_001c668f;
    }
    goto LAB_001c60fe;
  case TableInitId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableInit,currp);
    if (pEVar1->_id != TableInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableInit]";
      goto LAB_001c668f;
    }
    goto LAB_001c5f20;
  case TryId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_001c668f;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_001c5be8:
    pEVar1 = pEVar1 + 2;
    goto LAB_001c620d;
  case TryTableId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTryTable,currp);
    if (pEVar1->_id != TryTableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      goto LAB_001c668f;
    }
    goto LAB_001c5ca4;
  case ThrowId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_001c668f;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_001c668f;
    }
    break;
  case ThrowRefId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitThrowRef,currp);
    if (pEVar1->_id != ThrowRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ThrowRef]";
      goto LAB_001c668f;
    }
    goto LAB_001c5ca4;
  case TupleMakeId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_001c668f;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_001c668f;
    }
    goto LAB_001c5ca4;
  case RefI31Id:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefI31,currp);
    if (pEVar1->_id != RefI31Id) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefI31]";
      goto LAB_001c668f;
    }
    goto LAB_001c5ca4;
  case I31GetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_001c668f;
    }
    goto LAB_001c5ca4;
  case CallRefId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_001c668f;
    }
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_001c668f;
    }
    goto LAB_001c5ca4;
  case RefCastId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_001c668f;
    }
    goto LAB_001c5ca4;
  case BrOnId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_001c668f;
    }
LAB_001c5dc8:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_001c620d;
  case StructNewId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_001c668f;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_001c668f;
    }
    goto LAB_001c61ff;
  case StructSetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_001c668f;
    }
    goto LAB_001c5e43;
  case StructRMWId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStructRMW,currp);
    if (pEVar1->_id != StructRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructRMW]";
      goto LAB_001c668f;
    }
    goto LAB_001c5e43;
  case StructCmpxchgId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStructCmpxchg,currp);
    if (pEVar1->_id != StructCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructCmpxchg]";
      goto LAB_001c668f;
    }
LAB_001c5c09:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_001c5e4e;
  case ArrayNewId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_001c668f;
    }
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)&pEVar1[1].type);
LAB_001c5a3d:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x001c5a46:
    if (lVar4 != 0) {
LAB_001c5a4c:
      local_40 = StringifyWalker<TestStringifyWalker>::scan;
      SmallVector<wasm::Walker<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,wasm::UnifiedExpressionVisitor<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(StringifyTest_Print_Test::TestBody()::TestStringifyWalker*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,wasm::UnifiedExpressionVisitor<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,void>>::Task,10ul>
                  *)&(self->super_StringifyWalker<TestStringifyWalker>).
                     super_PostWalker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     .
                     super_Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewDataId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayNewData,currp);
    if (pEVar1->_id != ArrayNewDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewData]";
      goto LAB_001c668f;
    }
    goto LAB_001c5f2f;
  case ArrayNewElemId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayNewElem,currp);
    if (pEVar1->_id != ArrayNewElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewElem]";
      goto LAB_001c668f;
    }
    goto LAB_001c5f2f;
  case ArrayNewFixedId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_001c668f;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_001c668f;
    }
    goto LAB_001c610d;
  case ArraySetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_001c668f;
    }
    goto LAB_001c60fe;
  case ArrayLenId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_001c668f;
    }
    goto LAB_001c5ca4;
  case ArrayCopyId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_001c668f;
    }
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pEVar1 + 3));
    goto LAB_001c60ef;
  case ArrayFillId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_001c668f;
    }
LAB_001c60ef:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)&pEVar1[2].type);
    goto LAB_001c60fe;
  case ArrayInitDataId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayInitData,currp);
    if (pEVar1->_id != ArrayInitDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitData]";
      goto LAB_001c668f;
    }
    goto LAB_001c5534;
  case ArrayInitElemId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayInitElem,currp);
    if (pEVar1->_id != ArrayInitElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitElem]";
      goto LAB_001c668f;
    }
LAB_001c5534:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)&pEVar1[3].type);
LAB_001c5f20:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pEVar1 + 3));
LAB_001c5f2f:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_001c620d;
  case RefAsId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_001c668f;
    }
    goto LAB_001c61ff;
  case StringNewId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringNew,currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_001c668f;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = StringifyWalker<TestStringifyWalker>::scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,wasm::UnifiedExpressionVisitor<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(StringifyTest_Print_Test::TestBody()::TestStringifyWalker*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,wasm::UnifiedExpressionVisitor<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,void>>::Task,10ul>
                  *)&(self->super_StringifyWalker<TestStringifyWalker>).
                     super_PostWalker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     .
                     super_Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = StringifyWalker<TestStringifyWalker>::scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,wasm::UnifiedExpressionVisitor<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(StringifyTest_Print_Test::TestBody()::TestStringifyWalker*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,wasm::UnifiedExpressionVisitor<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,void>>::Task,10ul>
                  *)&(self->super_StringifyWalker<TestStringifyWalker>).
                     super_PostWalker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     .
                     super_Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    goto LAB_001c61ff;
  case StringConstId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_001c668f;
    }
    break;
  case StringMeasureId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_001c668f;
    }
LAB_001c61ff:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_001c620d;
  case StringEncodeId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringEncode,currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_001c668f;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = StringifyWalker<TestStringifyWalker>::scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,wasm::UnifiedExpressionVisitor<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(StringifyTest_Print_Test::TestBody()::TestStringifyWalker*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,wasm::UnifiedExpressionVisitor<StringifyTest_Print_Test::TestBody()::TestStringifyWalker,void>>::Task,10ul>
                  *)&(self->super_StringifyWalker<TestStringifyWalker>).
                     super_PostWalker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     .
                     super_Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    goto LAB_001c5e43;
  case StringConcatId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_001c668f;
    }
    goto LAB_001c610d;
  case StringEqId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_001c668f;
    }
LAB_001c5e43:
    currp_00 = pEVar1 + 2;
LAB_001c5e4e:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_001c620d;
  case StringWTF16GetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_001c668f;
    }
    goto LAB_001c610d;
  case StringSliceWTFId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_001c668f;
    }
LAB_001c60fe:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pEVar1 + 2));
LAB_001c610d:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_001c620d;
  case ContNewId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitContNew,currp);
    if (pEVar1->_id != ContNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContNew]";
      goto LAB_001c668f;
    }
LAB_001c5ca4:
    pEVar1 = pEVar1 + 1;
LAB_001c620d:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)pEVar1);
    return;
  case ContBindId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitContBind,currp);
    if (pEVar1->_id != ContBindId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContBind]";
      goto LAB_001c668f;
    }
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case SuspendId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSuspend,currp);
    if (pEVar1->_id != SuspendId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Suspend]";
      goto LAB_001c668f;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ResumeId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitResume,currp);
    if (pEVar1->_id != ResumeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Resume]";
      goto LAB_001c668f;
    }
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pEVar1 + 7));
    uVar2 = (uint)pEVar1[5].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[5].type.id <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(*(long *)(pEVar1 + 5) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ResumeThrowId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitResumeThrow,currp);
    if (pEVar1->_id != ResumeThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ResumeThrow]";
      goto LAB_001c668f;
    }
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pEVar1 + 8));
    uVar2 = (uint)pEVar1[6].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[6].type.id <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(*(long *)(pEVar1 + 6) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StackSwitchId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStackSwitch,currp);
    if (pEVar1->_id != StackSwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StackSwitch]";
      goto LAB_001c668f;
    }
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pEVar1 + 4));
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_001c62c4;
        Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
        pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                  *)self,StringifyWalker<TestStringifyWalker>::scan,
                 (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }